

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::iterate(FunctionalTest18_19 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  uint local_70;
  uint local_6c;
  uint n_subroutine_uniform_vec4_operator2;
  uint n_subroutine_uniform_vec4_operator1;
  uint n_subroutine_uniform_bool_operator2;
  uint n_subroutine_uniform_bool_operator1;
  uint n_subroutine_vec4_operators;
  GLuint subroutine_vec4_operators [2];
  uint n_subroutine_bool_operators;
  GLuint subroutine_bool_operators [2];
  allocator<char> local_31;
  string local_30;
  FunctionalTest18_19 *local_10;
  FunctionalTest18_19 *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_shader_subroutine is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  subroutine_vec4_operators[1] = this->m_po_subroutine_returns_false_location;
  subroutine_vec4_operators[0] = 2;
  n_subroutine_uniform_bool_operator1 = this->m_po_subroutine_divide_by_two_location;
  n_subroutine_vec4_operators = this->m_po_subroutine_multiply_by_four_location;
  for (n_subroutine_uniform_vec4_operator1 = 0; n_subroutine_uniform_vec4_operator1 < 2;
      n_subroutine_uniform_vec4_operator1 = n_subroutine_uniform_vec4_operator1 + 1) {
    for (n_subroutine_uniform_vec4_operator2 = 0; n_subroutine_uniform_vec4_operator2 < 2;
        n_subroutine_uniform_vec4_operator2 = n_subroutine_uniform_vec4_operator2 + 1) {
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
          executeTest(this,subroutine_vec4_operators[(ulong)n_subroutine_uniform_vec4_operator1 + 1]
                      ,subroutine_vec4_operators[(ulong)n_subroutine_uniform_vec4_operator2 + 1],
                      (&n_subroutine_uniform_bool_operator1)[local_6c],
                      (&n_subroutine_uniform_bool_operator1)[local_70]);
        }
      }
    }
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest18_19::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize all GL objects required to run the test */
	initTest();

	/* Iterate over all subroutine permutations */
	const glw::GLuint subroutine_bool_operators[] = { m_po_subroutine_returns_false_location,
													  m_po_subroutine_returns_true_location };
	const unsigned int n_subroutine_bool_operators =
		sizeof(subroutine_bool_operators) / sizeof(subroutine_bool_operators[0]);

	const glw::GLuint subroutine_vec4_operators[] = { m_po_subroutine_divide_by_two_location,
													  m_po_subroutine_multiply_by_four_location };
	const unsigned int n_subroutine_vec4_operators =
		sizeof(subroutine_vec4_operators) / sizeof(subroutine_vec4_operators[0]);

	for (unsigned int n_subroutine_uniform_bool_operator1 = 0;
		 n_subroutine_uniform_bool_operator1 < n_subroutine_bool_operators; ++n_subroutine_uniform_bool_operator1)
	{
		for (unsigned int n_subroutine_uniform_bool_operator2 = 0;
			 n_subroutine_uniform_bool_operator2 < n_subroutine_bool_operators; ++n_subroutine_uniform_bool_operator2)
		{
			for (unsigned int n_subroutine_uniform_vec4_operator1 = 0;
				 n_subroutine_uniform_vec4_operator1 < n_subroutine_vec4_operators;
				 ++n_subroutine_uniform_vec4_operator1)
			{
				for (unsigned int n_subroutine_uniform_vec4_operator2 = 0;
					 n_subroutine_uniform_vec4_operator2 < n_subroutine_vec4_operators;
					 ++n_subroutine_uniform_vec4_operator2)
				{
					executeTest(subroutine_bool_operators[n_subroutine_uniform_bool_operator1],
								subroutine_bool_operators[n_subroutine_uniform_bool_operator2],
								subroutine_vec4_operators[n_subroutine_uniform_vec4_operator1],
								subroutine_vec4_operators[n_subroutine_uniform_vec4_operator2]);
				} /* for (all subroutine vec4 operator subroutines used for processor2) */
			}	 /* for (all subroutine vec4 operator subroutines used for processor1) */
		}		  /* for (all subroutine bool operator subroutines used for operator2) */
	}			  /* for (all subroutine bool operator subroutines used for operator1) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}